

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O0

KNearestNeighborsClassifier *
buildBasicNearestNeighborClassifier
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,char *outTensorName)

{
  ModelDescription *pMVar1;
  FeatureType *pFVar2;
  Int64Parameter *pIVar3;
  Int64Set *this;
  SingleKdTreeIndex *this_00;
  StringVector *this_01;
  allocator<char> local_99;
  string local_98;
  float local_78;
  int local_74;
  RepeatedField<float> *pRStack_70;
  int i_1;
  RepeatedField<float> *pointVector;
  FloatVector *floatVector;
  NearestNeighborsIndex *nearestNeighborIndex;
  KNearestNeighborsClassifier *pKStack_50;
  int numberOfNeighbors;
  KNearestNeighborsClassifier *nearestNeighborClassifier;
  FeatureDescription *outTensor;
  ArrayFeatureType *pAStack_38;
  int i;
  ArrayFeatureType *inTensorShape;
  FeatureDescription *inTensor;
  char *outTensorName_local;
  TensorAttributes *inTensorAttr_local;
  Model *pMStack_10;
  bool isUpdatable_local;
  Model *m_local;
  
  inTensor = (FeatureDescription *)outTensorName;
  outTensorName_local = (char *)inTensorAttr;
  inTensorAttr_local._7_1_ = isUpdatable;
  pMStack_10 = m;
  pMVar1 = CoreML::Specification::Model::mutable_description(m);
  inTensorShape = (ArrayFeatureType *)CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name
            ((FeatureDescription *)inTensorShape,*(char **)outTensorName_local);
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)inTensorShape);
  pAStack_38 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAStack_38,ArrayFeatureType_ArrayDataType_FLOAT32);
  for (outTensor._4_4_ = 0; outTensor._4_4_ < *(int *)(outTensorName_local + 8);
      outTensor._4_4_ = outTensor._4_4_ + 1) {
    CoreML::Specification::ArrayFeatureType::add_shape(pAStack_38,1);
  }
  pMVar1 = CoreML::Specification::Model::mutable_description(pMStack_10);
  nearestNeighborClassifier =
       (KNearestNeighborsClassifier *)CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name
            ((FeatureDescription *)nearestNeighborClassifier,(char *)inTensor);
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)nearestNeighborClassifier);
  CoreML::Specification::FeatureType::mutable_stringtype(pFVar2);
  pMVar1 = CoreML::Specification::Model::mutable_description(pMStack_10);
  CoreML::Specification::ModelDescription::set_predictedfeaturename(pMVar1,(char *)inTensor);
  CoreML::Specification::Model::set_specificationversion(pMStack_10,4);
  pKStack_50 = CoreML::Specification::Model::mutable_knearestneighborsclassifier(pMStack_10);
  nearestNeighborIndex._4_4_ = 3;
  pIVar3 = CoreML::Specification::KNearestNeighborsClassifier::mutable_numberofneighbors(pKStack_50)
  ;
  this = CoreML::Specification::Int64Parameter::mutable_set(pIVar3);
  CoreML::Specification::Int64Set::add_values(this,(long)nearestNeighborIndex._4_4_);
  pIVar3 = CoreML::Specification::KNearestNeighborsClassifier::mutable_numberofneighbors(pKStack_50)
  ;
  CoreML::Specification::Int64Parameter::set_defaultvalue(pIVar3,(long)nearestNeighborIndex._4_4_);
  floatVector = (FloatVector *)
                CoreML::Specification::KNearestNeighborsClassifier::mutable_nearestneighborsindex
                          (pKStack_50);
  this_00 = CoreML::Specification::NearestNeighborsIndex::mutable_singlekdtreeindex
                      ((NearestNeighborsIndex *)floatVector);
  CoreML::Specification::SingleKdTreeIndex::set_leafsize(this_00,0x1e);
  CoreML::Specification::NearestNeighborsIndex::mutable_squaredeuclideandistance
            ((NearestNeighborsIndex *)floatVector);
  CoreML::Specification::NearestNeighborsIndex::set_numberofdimensions
            ((NearestNeighborsIndex *)floatVector,*(int32 *)(outTensorName_local + 8));
  pointVector = (RepeatedField<float> *)
                CoreML::Specification::NearestNeighborsIndex::add_floatsamples
                          ((NearestNeighborsIndex *)floatVector);
  pRStack_70 = CoreML::Specification::FloatVector::mutable_vector((FloatVector *)pointVector);
  for (local_74 = 0; local_74 < *(int *)(outTensorName_local + 8); local_74 = local_74 + 1) {
    local_78 = (float)local_74;
    google::protobuf::RepeatedField<float>::Add(pRStack_70,&local_78);
  }
  CoreML::Specification::KNearestNeighborsClassifier::mutable_uniformweighting(pKStack_50);
  this_01 = CoreML::Specification::KNearestNeighborsClassifier::mutable_stringclasslabels
                      (pKStack_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"zero",&local_99);
  CoreML::Specification::StringVector::add_vector(this_01,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  if ((inTensorAttr_local._7_1_ & 1) != 0) {
    CoreML::Specification::Model::set_isupdatable(pMStack_10,true);
  }
  return pKStack_50;
}

Assistant:

Specification::KNearestNeighborsClassifier* buildBasicNearestNeighborClassifier(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, const char *outTensorName) {
    auto inTensor = m.mutable_description()->add_input();
    inTensor->set_name(inTensorAttr->name);
    auto inTensorShape = inTensor->mutable_type()->mutable_multiarraytype();
    inTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < inTensorAttr->dimension; i++) {
        inTensorShape->add_shape(1);
    }
    
    auto outTensor = m.mutable_description()->add_output();
    outTensor->set_name(outTensorName);
    outTensor->mutable_type()->mutable_stringtype();
    
    m.mutable_description()->set_predictedfeaturename(outTensorName);
    
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    
    auto nearestNeighborClassifier = m.mutable_knearestneighborsclassifier();
    int numberOfNeighbors = 3;
    nearestNeighborClassifier->mutable_numberofneighbors()->mutable_set()->add_values(numberOfNeighbors);
    nearestNeighborClassifier->mutable_numberofneighbors()->set_defaultvalue(numberOfNeighbors);

    auto nearestNeighborIndex = nearestNeighborClassifier->mutable_nearestneighborsindex();
    
    nearestNeighborIndex->mutable_singlekdtreeindex()->set_leafsize(30);
    nearestNeighborIndex->mutable_squaredeuclideandistance();
    
    nearestNeighborIndex->set_numberofdimensions(inTensorAttr->dimension);
    
    auto floatVector = nearestNeighborIndex->add_floatsamples();
    auto pointVector = floatVector->mutable_vector();
    for (int i = 0; i < inTensorAttr->dimension; i++) {
        pointVector->Add((float)i);
    }
    
    nearestNeighborClassifier->mutable_uniformweighting();
    nearestNeighborClassifier->mutable_stringclasslabels()->add_vector(std::string("zero"));
    
    if (isUpdatable) {
        m.set_isupdatable(true);
    }
    
    return nearestNeighborClassifier;
}